

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easm.c
# Opt level: O0

void easm_del_directive(easm_directive *directive)

{
  int local_14;
  int i;
  easm_directive *directive_local;
  
  if (directive != (easm_directive *)0x0) {
    for (local_14 = 0; local_14 < directive->paramsnum; local_14 = local_14 + 1) {
      easm_del_expr(directive->params[local_14]);
    }
    free(directive->params);
    free(directive->str);
    free(directive);
  }
  return;
}

Assistant:

void easm_del_directive(struct easm_directive *directive) {
	if (!directive) return;
	int i;
	for (i = 0; i < directive->paramsnum; i++)
		easm_del_expr(directive->params[i]);
	free(directive->params);
	free(directive->str);
	free(directive);
}